

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_choice(lysp_yin_ctx *ctx,tree_node_meta *node_meta)

{
  uint16_t *puVar1;
  lysp_node *plVar2;
  lysp_ext_instance *object;
  yin_subelement *subelems_00;
  LY_ERR LVar3;
  LY_ERR LVar4;
  lysp_node *parent;
  lysp_node **pplVar5;
  lysp_node *plVar6;
  LY_ERR ret__;
  yin_subelement *subelems;
  lysp_qname **local_48;
  char **local_40;
  lysp_node **local_38;
  
  subelems = (yin_subelement *)0x0;
  parent = (lysp_node *)calloc(1,0x68);
  if (parent == (lysp_node *)0x0) {
    LVar3 = LY_EMEM;
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_choice");
  }
  else {
    pplVar5 = node_meta->nodes;
    plVar2 = *pplVar5;
    if (*pplVar5 != (lysp_node *)0x0) {
      do {
        plVar6 = plVar2;
        plVar2 = plVar6->next;
      } while (plVar2 != (lysp_node *)0x0);
      pplVar5 = &plVar6->next;
    }
    *pplVar5 = parent;
    parent->nodetype = 2;
    parent->parent = node_meta->parent;
    LVar3 = lyxml_ctx_next(ctx->xmlctx);
    if (LVar3 == LY_SUCCESS) {
      LVar3 = yin_parse_attribute(ctx,YIN_ARG_NAME,&parent->name,Y_IDENTIF_ARG,LY_STMT_CHOICE);
      if (LVar3 == LY_SUCCESS) {
        plVar2 = parent + 1;
        puVar1 = &parent->flags;
        local_38 = &parent[1].next;
        local_40 = &parent->dsc;
        local_48 = &parent->iffeatures;
        LVar4 = subelems_allocator(ctx,0x11,parent,&subelems,0x20,plVar2,8,0x40,plVar2,0,0x100,
                                   plVar2,0,0x200,plVar2,8,0x50000,puVar1,2,0x400,plVar2,0,0x70000,
                                   local_38,2,0x80000,local_40,2,0x130000,local_48,0,0x1000,plVar2,0
                                   ,0x2000,plVar2,0,0x4000,plVar2,0,0x180000,puVar1,2,0x270000,
                                   &parent->ref,2,0x2c0000,puVar1,2,0x330000,&parent[1].nodetype,2,
                                   0xf0000,0,0);
        subelems_00 = subelems;
        LVar3 = LY_EMEM;
        if (LVar4 == LY_SUCCESS) {
          LVar3 = yin_parse_content(ctx,subelems,0x11,parent,LY_STMT_CHOICE,(char **)0x0,
                                    &parent->exts);
          subelems_deallocator(0x11,subelems_00);
          if (LVar3 == LY_SUCCESS) {
            object = parent->exts;
            if (object != (lysp_ext_instance *)0x0) {
              LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0);
              if (LVar3 != LY_SUCCESS) {
                return LVar3 + (LVar3 == LY_SUCCESS);
              }
            }
            LVar3 = LY_SUCCESS;
          }
        }
      }
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
yin_parse_choice(struct lysp_yin_ctx *ctx, struct tree_node_meta *node_meta)
{
    LY_ERR ret = LY_SUCCESS;
    struct yin_subelement *subelems = NULL;
    struct lysp_node_choice *choice;
    size_t subelems_size;

    /* create new choice */
    LY_LIST_NEW_RET(ctx->xmlctx->ctx, node_meta->nodes, choice, next, LY_EMEM);

    choice->nodetype = LYS_CHOICE;
    choice->parent = node_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &choice->name, Y_IDENTIF_ARG, LY_STMT_CHOICE));

    /* parse choice content */
    LY_CHECK_RET(subelems_allocator(ctx, subelems_size = 17, (struct lysp_node *)choice, &subelems,
            LY_STMT_ANYDATA, &choice->child, YIN_SUBELEM_VER2,
            LY_STMT_ANYXML, &choice->child, 0,
            LY_STMT_CASE, &choice->child, 0,
            LY_STMT_CHOICE, &choice->child, YIN_SUBELEM_VER2,
            LY_STMT_CONFIG, &choice->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_CONTAINER, &choice->child, 0,
            LY_STMT_DEFAULT, &choice->dflt, YIN_SUBELEM_UNIQUE,
            LY_STMT_DESCRIPTION, &choice->dsc, YIN_SUBELEM_UNIQUE,
            LY_STMT_IF_FEATURE, &choice->iffeatures, 0,
            LY_STMT_LEAF, &choice->child, 0,
            LY_STMT_LEAF_LIST, &choice->child, 0,
            LY_STMT_LIST, &choice->child, 0,
            LY_STMT_MANDATORY, &choice->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_REFERENCE, &choice->ref, YIN_SUBELEM_UNIQUE,
            LY_STMT_STATUS, &choice->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_WHEN, &choice->when, YIN_SUBELEM_UNIQUE,
            LY_STMT_EXTENSION_INSTANCE, NULL, 0));
    ret = yin_parse_content(ctx, subelems, subelems_size, choice, LY_STMT_CHOICE, NULL, &choice->exts);
    subelems_deallocator(subelems_size, subelems);
    LY_CHECK_RET(ret);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, choice->exts));

    return ret;
}